

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O1

uint2048 * from_issue_339::modInverse(uint2048 A,uint2048 M)

{
  enable_if_t<std::is_integral<int>::value,_bool> eVar1;
  bool bVar2;
  uintwide_t<2048U,_unsigned_int,_void,_false> *__src;
  uintwide_t<4096U,_unsigned_int,_void,_false> *__src_00;
  ulong uVar3;
  unsigned_fast_type i;
  long lVar4;
  uint2048 *in_RDI;
  uint4096 x;
  other_wide_integer_type other_1;
  uint4096 m0;
  uint4096 t;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_e30;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_c30;
  undefined1 local_a30 [256];
  undefined1 auStack_930 [256];
  uintwide_t<4096U,_unsigned_int,_void,_false> local_830;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_630 [2];
  uintwide_t<4096U,_unsigned_int,_void,_false> local_430;
  undefined1 local_230 [256];
  undefined1 auStack_130 [256];
  
  memset(local_830.values.super_array<unsigned_int,_128UL>.elems + 0x40,0,0x100);
  memcpy(&local_830,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,0x100);
  memset(&local_430,0,0x200);
  memset(&local_c30,0,0x200);
  local_c30.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
  memset(local_c30.values.super_array<unsigned_int,_128UL>.elems + 1,0,0x1fc);
  local_e30.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
  eVar1 = math::wide_integer::operator==
                    ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,
                     (int *)&local_e30);
  if (eVar1) {
    memset(in_RDI,0,0x100);
  }
  else {
    local_e30.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
    eVar1 = math::wide_integer::operator>
                      ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,
                       (int *)&local_e30);
    if (eVar1) {
      do {
        memcpy(&local_e30,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,0x100);
        __src = math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::operator/=
                          ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_e30,
                           (uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108);
        memcpy(local_a30,__src,0x100);
        lVar4 = 0;
        memset(auStack_930,0,0x100);
        memset(auStack_130,0,0x100);
        memcpy(local_230,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,0x100);
        memcpy(local_630,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,0x100);
        memset(&local_e30,0,0x100);
        math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::eval_divide_knuth
                  (local_630,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,
                   (uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_e30);
        memcpy(local_630,&local_e30,0x100);
        memcpy((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,local_630,0x100);
        memcpy((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,local_230,0x100);
        memcpy(local_230,&local_430,0x200);
        memcpy(&local_e30,local_a30,0x200);
        __src_00 = math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator*=
                             (&local_e30,&local_430);
        memcpy(local_630,__src_00,0x200);
        memcpy(&local_e30,&local_c30,0x200);
        bVar2 = false;
        do {
          uVar3 = ((ulong)local_e30.values.super_array<unsigned_int,_128UL>.elems[lVar4] -
                  (ulong)bVar2) -
                  (ulong)local_630[0].values.super_array<unsigned_int,_64UL>.elems[lVar4];
          local_e30.values.super_array<unsigned_int,_128UL>.elems[lVar4] =
               (value_type_conflict)uVar3;
          bVar2 = uVar3 >> 0x20 != 0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x80);
        memcpy(&local_430,&local_e30,0x200);
        memcpy(&local_c30,local_230,0x200);
        local_e30.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
        eVar1 = math::wide_integer::operator>
                          ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,
                           (int *)&local_e30);
      } while (eVar1);
    }
    local_e30.values.super_array<unsigned_int,_128UL>.elems[0] = 0;
    eVar1 = math::wide_integer::operator<(&local_c30,(int *)&local_e30);
    if (eVar1) {
      math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator+=
                (&local_c30,&local_830);
    }
    memcpy(in_RDI,&local_c30,0x100);
  }
  return in_RDI;
}

Assistant:

auto modInverse(uint2048 A, uint2048 M) -> uint2048 // NOLINT(readability-identifier-naming)
  {
    uint4096 m0 = M;
    uint4096 y  = 0;
    uint4096 x  = 1;

    if(M == 1)
    {
      return 0; // LCOV_EXCL_LINE
    }

    while (A > 1)
    {
      uint4096 q = A / M;
      uint4096 t = M;

      M = A % M;
      A = t;
      t = y;

      y = x - q * y;
      x = t;
    }

    if (x < 0)
    {
      x += m0; // LCOV_EXCL_LINE
    }

    return x;
  }